

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dhm.c
# Opt level: O1

int mbedtls_dhm_calc_secret
              (mbedtls_dhm_context *ctx,uchar *output,size_t output_size,size_t *olen,
              _func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng)

{
  mbedtls_mpi *pmVar1;
  mbedtls_mpi *P;
  mbedtls_mpi *pmVar2;
  mbedtls_mpi *X;
  mbedtls_mpi *X_00;
  int iVar3;
  int iVar4;
  size_t sVar5;
  mbedtls_mpi GYb;
  mbedtls_mpi local_48;
  
  if (ctx == (mbedtls_dhm_context *)0x0) {
    return -0x3080;
  }
  if (output_size < ctx->len) {
    return -0x3080;
  }
  pmVar1 = &ctx->GY;
  P = &ctx->P;
  iVar3 = dhm_check_range(pmVar1,P);
  if (iVar3 != 0) {
    return iVar3;
  }
  mbedtls_mpi_init(&local_48);
  if (f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0) {
    iVar3 = mbedtls_mpi_copy(&local_48,pmVar1);
  }
  else {
    pmVar2 = &ctx->X;
    iVar3 = mbedtls_mpi_cmp_mpi(pmVar2,&ctx->pX);
    if (iVar3 == 0) {
      X = &ctx->Vi;
      iVar3 = mbedtls_mpi_cmp_int(X,1);
      if (iVar3 == 0) {
        iVar4 = 0;
        do {
          sVar5 = mbedtls_mpi_size(P);
          mbedtls_mpi_fill_random(X,sVar5,f_rng,p_rng);
          while (iVar3 = mbedtls_mpi_cmp_mpi(X,P), -1 < iVar3) {
            iVar3 = mbedtls_mpi_shift_r(X,1);
            if (iVar3 != 0) goto LAB_0012d67d;
          }
          if (iVar4 == 0xb) {
            iVar3 = -0xe;
            goto LAB_0012d67d;
          }
          iVar4 = iVar4 + 1;
          iVar3 = mbedtls_mpi_cmp_int(X,1);
        } while (iVar3 < 1);
        X_00 = &ctx->Vf;
        iVar3 = mbedtls_mpi_inv_mod(X_00,X,P);
        if (iVar3 == 0) {
          iVar3 = mbedtls_mpi_exp_mod(X_00,X_00,pmVar2,P,&ctx->RP);
        }
      }
      else {
        iVar3 = mbedtls_mpi_mul_mpi(X,X,X);
        if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_mod_mpi(X,X,P), iVar3 == 0)) {
          pmVar2 = &ctx->Vf;
          iVar3 = mbedtls_mpi_mul_mpi(pmVar2,pmVar2,pmVar2);
          if (iVar3 == 0) {
            iVar3 = mbedtls_mpi_mod_mpi(pmVar2,pmVar2,P);
            goto LAB_0012d4c3;
          }
        }
      }
    }
    else {
      iVar3 = mbedtls_mpi_copy(&ctx->pX,pmVar2);
      if ((iVar3 == 0) && (iVar3 = mbedtls_mpi_lset(&ctx->Vi,1), iVar3 == 0)) {
        iVar3 = mbedtls_mpi_lset(&ctx->Vf,1);
LAB_0012d4c3:
        if (iVar3 == 0) {
          iVar3 = 0;
        }
      }
    }
LAB_0012d67d:
    if ((iVar3 != 0) || (iVar3 = mbedtls_mpi_mul_mpi(&local_48,pmVar1,&ctx->Vi), iVar3 != 0))
    goto LAB_0012d6b4;
    iVar3 = mbedtls_mpi_mod_mpi(&local_48,&local_48,P);
  }
  if (iVar3 == 0) {
    pmVar1 = &ctx->K;
    iVar3 = mbedtls_mpi_exp_mod(pmVar1,&local_48,&ctx->X,P,&ctx->RP);
    if ((iVar3 == 0) &&
       ((f_rng == (_func_int_void_ptr_uchar_ptr_size_t *)0x0 ||
        ((iVar3 = mbedtls_mpi_mul_mpi(pmVar1,pmVar1,&ctx->Vf), iVar3 == 0 &&
         (iVar3 = mbedtls_mpi_mod_mpi(pmVar1,pmVar1,P), iVar3 == 0)))))) {
      sVar5 = mbedtls_mpi_size(pmVar1);
      *olen = sVar5;
      iVar3 = mbedtls_mpi_write_binary(pmVar1,output,sVar5);
    }
  }
LAB_0012d6b4:
  mbedtls_mpi_free(&local_48);
  iVar4 = iVar3 + -0x3300;
  if (iVar3 == 0) {
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int mbedtls_dhm_calc_secret( mbedtls_dhm_context *ctx,
                     unsigned char *output, size_t output_size, size_t *olen,
                     int (*f_rng)(void *, unsigned char *, size_t),
                     void *p_rng )
{
    int ret;
    mbedtls_mpi GYb;

    if( ctx == NULL || output_size < ctx->len )
        return( MBEDTLS_ERR_DHM_BAD_INPUT_DATA );

    if( ( ret = dhm_check_range( &ctx->GY, &ctx->P ) ) != 0 )
        return( ret );

    mbedtls_mpi_init( &GYb );

    /* Blind peer's value */
    if( f_rng != NULL )
    {
        MBEDTLS_MPI_CHK( dhm_update_blinding( ctx, f_rng, p_rng ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &GYb, &ctx->GY, &ctx->Vi ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &GYb, &GYb, &ctx->P ) );
    }
    else
        MBEDTLS_MPI_CHK( mbedtls_mpi_copy( &GYb, &ctx->GY ) );

    /* Do modular exponentiation */
    MBEDTLS_MPI_CHK( mbedtls_mpi_exp_mod( &ctx->K, &GYb, &ctx->X,
                          &ctx->P, &ctx->RP ) );

    /* Unblind secret value */
    if( f_rng != NULL )
    {
        MBEDTLS_MPI_CHK( mbedtls_mpi_mul_mpi( &ctx->K, &ctx->K, &ctx->Vf ) );
        MBEDTLS_MPI_CHK( mbedtls_mpi_mod_mpi( &ctx->K, &ctx->K, &ctx->P ) );
    }

    *olen = mbedtls_mpi_size( &ctx->K );

    MBEDTLS_MPI_CHK( mbedtls_mpi_write_binary( &ctx->K, output, *olen ) );

cleanup:
    mbedtls_mpi_free( &GYb );

    if( ret != 0 )
        return( MBEDTLS_ERR_DHM_CALC_SECRET_FAILED + ret );

    return( 0 );
}